

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_align.c
# Opt level: O0

void print_rowcol(char *filename,int *row,int *col,char *s1,int s1Len,char *s2,int s2Len,
                 parasail_result_t *result)

{
  int iVar1;
  FILE *__stream;
  int *piVar2;
  char *pcVar3;
  FILE *f;
  int j;
  int i;
  char *s2_local;
  int s1Len_local;
  char *s1_local;
  int *col_local;
  int *row_local;
  char *filename_local;
  
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    printf("fopen(\"%s\") error: %s\n",filename,pcVar3);
    exit(-1);
  }
  iVar1 = parasail_result_is_saturated(result);
  fprintf(__stream,"saturated=%d\n",(ulong)(iVar1 != 0));
  fprintf(__stream,"%c",(ulong)(uint)(int)s1[s1Len + -1]);
  if (row == (int *)0x0) {
    for (f._0_4_ = 0; (int)f < s2Len; f._0_4_ = (int)f + 1) {
      fprintf(__stream,"%4c",0x21);
    }
  }
  else {
    for (f._0_4_ = 0; (int)f < s2Len; f._0_4_ = (int)f + 1) {
      fprintf(__stream,"%4d",(ulong)(uint)row[(int)f]);
    }
  }
  fprintf(__stream,"\n");
  fprintf(__stream,"%c",(ulong)(uint)(int)s2[s2Len + -1]);
  if (col == (int *)0x0) {
    for (f._4_4_ = 0; f._4_4_ < s1Len; f._4_4_ = f._4_4_ + 1) {
      fprintf(__stream,"%4c",0x21);
    }
  }
  else {
    for (f._4_4_ = 0; f._4_4_ < s1Len; f._4_4_ = f._4_4_ + 1) {
      fprintf(__stream,"%4d",(ulong)(uint)col[f._4_4_]);
    }
  }
  fprintf(__stream,"\n");
  fclose(__stream);
  return;
}

Assistant:

static void print_rowcol(
        const char * filename,
        const int * const restrict row,
        const int * const restrict col,
        const char * const restrict s1, const int s1Len,
        const char * const restrict s2, const int s2Len,
        parasail_result_t *result)
{
    int i;
    int j;
    FILE *f = NULL;

    f = fopen(filename, "w");
    if (NULL == f) {
        printf("fopen(\"%s\") error: %s\n", filename, strerror(errno));
        exit(-1);
    }
    fprintf(f, "saturated=%d\n", parasail_result_is_saturated(result) ? 1 : 0);
    fprintf(f, "%c", s1[s1Len-1]);
    if (NULL == row) {
        for (j=0; j<s2Len; ++j) {
            fprintf(f, "%4c", '!');
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            fprintf(f, "%4d", row[j]);
        }
    }
    fprintf(f, "\n");
    fprintf(f, "%c", s2[s2Len-1]);
    if (NULL == col) {
        for (i=0; i<s1Len; ++i) {
            fprintf(f, "%4c", '!');
        }
    }
    else {
        for (i=0; i<s1Len; ++i) {
            fprintf(f, "%4d", col[i]);
        }
    }
    fprintf(f, "\n");
    fclose(f);
}